

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

_Bool parse_arc_flag(char **begin,char *end,_Bool *flag)

{
  _Bool _Var1;
  _Bool *flag_local;
  char *end_local;
  char **begin_local;
  
  _Var1 = plutovg_skip_delim(begin,end,'0');
  if (_Var1) {
    *flag = false;
  }
  else {
    _Var1 = plutovg_skip_delim(begin,end,'1');
    if (!_Var1) {
      return false;
    }
    *flag = true;
  }
  plutovg_skip_ws_or_comma(begin,end,(_Bool *)0x0);
  return true;
}

Assistant:

static inline bool parse_arc_flag(const char** begin, const char* end, bool* flag)
{
    if(plutovg_skip_delim(begin, end, '0'))
        *flag = 0;
    else if(plutovg_skip_delim(begin, end, '1'))
        *flag = 1;
    else
        return false;
    plutovg_skip_ws_or_comma(begin, end, NULL);
    return true;
}